

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

Value * duckdb::CheckQuantile(Value *quantile_val)

{
  bool bVar1;
  BinderException *pBVar2;
  double dVar3;
  allocator local_39;
  string local_38 [32];
  
  if (quantile_val[0x18] == (Value)0x1) {
    pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string(local_38,"QUANTILE parameter cannot be NULL",&local_39);
    duckdb::BinderException::BinderException(pBVar2,local_38);
    __cxa_throw(pBVar2,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar3 = duckdb::Value::GetValue<double>();
  if (ABS(dVar3) <= 1.0) {
    bVar1 = duckdb::Value::IsNan<double>(dVar3);
    if (!bVar1) {
      return quantile_val;
    }
    pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string(local_38,"QUANTILE parameter cannot be NaN",&local_39);
    duckdb::BinderException::BinderException(pBVar2,local_38);
    __cxa_throw(pBVar2,&BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar2 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            (local_38,"QUANTILE can only take parameters in the range [-1, 1]",&local_39);
  duckdb::BinderException::BinderException(pBVar2,local_38);
  __cxa_throw(pBVar2,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static const Value &CheckQuantile(const Value &quantile_val) {
	if (quantile_val.IsNull()) {
		throw BinderException("QUANTILE parameter cannot be NULL");
	}
	auto quantile = quantile_val.GetValue<double>();
	if (quantile < -1 || quantile > 1) {
		throw BinderException("QUANTILE can only take parameters in the range [-1, 1]");
	}
	if (Value::IsNan(quantile)) {
		throw BinderException("QUANTILE parameter cannot be NaN");
	}

	return quantile_val;
}